

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tls.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Tls::readCrl(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *__return_storage_ptr__,Tls *this,Path *path)

{
  Client *client;
  string local_80;
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  Url local_40;
  Path *local_20;
  Path *path_local;
  Tls *this_local;
  
  client = *(Client **)this;
  local_20 = path;
  path_local = (Path *)this;
  this_local = (Tls *)__return_storage_ptr__;
  Vault::operator+(&local_80,"crls/",path);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Tiny(&local_60,&local_80);
  getUrl(&local_40,this,&local_60);
  HttpConsumer::get(__return_storage_ptr__,client,&local_40);
  Tiny<Vault::UrlDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_40);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> Vault::Tls::readCrl(const Path &path) const {
  return HttpConsumer::get(client_, getUrl(Path{"crls/" + path}));
}